

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_> *
__thiscall
iDynTree::optimalcontrol::OptimalControlProblem::getConstraintsTimeRanges
          (OptimalControlProblem *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pTVar3;
  pointer pTVar4;
  undefined8 uVar5;
  uint uVar6;
  vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
  *pvVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  OptimalControlProblemPimpl *pOVar12;
  
  uVar6 = countConstraints(this);
  pOVar12 = this->m_pimpl;
  if (((long)(pOVar12->constraintsTimeRanges).
             super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ._M_impl.super__Vector_impl_data._M_finish -
      (long)(pOVar12->constraintsTimeRanges).
            super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
            ._M_impl.super__Vector_impl_data._M_start) / 0x18 != (ulong)uVar6) {
    std::
    vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
    ::resize(&pOVar12->constraintsTimeRanges,(ulong)uVar6);
    pOVar12 = this->m_pimpl;
  }
  p_Var8 = (pOVar12->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar11 = 0;
  while ((_Rb_tree_header *)p_Var8 !=
         &(pOVar12->constraintsGroups)._M_t._M_impl.super__Rb_tree_header) {
    pvVar7 = ConstraintsGroup::getTimeRanges((ConstraintsGroup *)**(undefined8 **)(p_Var8 + 2));
    lVar10 = 0;
    for (uVar9 = 0;
        pTVar3 = (pvVar7->
                 super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)(((long)(pvVar7->
                               super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3) / 0x18);
        uVar9 = uVar9 + 1) {
      pTVar4 = (this->m_pimpl->constraintsTimeRanges).
               super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (&pTVar4[lVar11].m_anyTime)[lVar10] = (&pTVar3->m_anyTime)[lVar10];
      puVar1 = (undefined8 *)((long)&pTVar3->m_initTime + lVar10);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pTVar4[lVar11].m_initTime + lVar10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar10 = lVar10 + 0x18;
    }
    p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    lVar11 = lVar11 + uVar9;
  }
  return &this->m_pimpl->constraintsTimeRanges;
}

Assistant:

std::vector<TimeRange> &OptimalControlProblem::getConstraintsTimeRanges() const
        {
            unsigned int nc = countConstraints();

            if (m_pimpl->constraintsTimeRanges.size() != nc)
                m_pimpl->constraintsTimeRanges.resize(nc);

            size_t index = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                std::vector<TimeRange> &groupTimeRanges = group.second->group_ptr->getTimeRanges();
                for (size_t i = 0; i < groupTimeRanges.size(); ++i){
                    m_pimpl->constraintsTimeRanges[index] = groupTimeRanges[i];
                    ++index;
                }
            }
            return m_pimpl->constraintsTimeRanges;
        }